

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O3

string * __thiscall
t_d_generator::render_req_abi_cxx11_(string *__return_storage_ptr__,t_d_generator *this,e_req req)

{
  undefined8 uVar1;
  char *pcVar2;
  char *pcVar3;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190;
  
  if (req == T_REQUIRED) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "TReq.REQUIRED";
    pcVar2 = "";
  }
  else if (req == T_OPTIONAL) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "TReq.OPTIONAL";
    pcVar2 = "";
  }
  else {
    if (req != T_OPT_IN_REQ_OUT) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_190,"Compiler error: Invalid requirement level ",0x2a);
      std::ostream::operator<<(&local_190,req);
      uVar1 = __cxa_allocate_exception(0x20);
      std::__cxx11::stringbuf::str();
      __cxa_throw(uVar1,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "TReq.OPT_IN_REQ_OUT";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

string render_req(t_field::e_req req) const {
    switch (req) {
    case t_field::T_OPT_IN_REQ_OUT:
      return "TReq.OPT_IN_REQ_OUT";
    case t_field::T_OPTIONAL:
      return "TReq.OPTIONAL";
    case t_field::T_REQUIRED:
      return "TReq.REQUIRED";
    default: {
      std::stringstream ss;
      ss << "Compiler error: Invalid requirement level " << req;
      throw ss.str();
    }
    }
  }